

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZNLMultGridAnalysis.cpp
# Opt level: O2

void __thiscall
TPZNonLinMultGridAnalysis::SmoothingSolution
          (TPZNonLinMultGridAnalysis *this,REAL tol,int numiter,TPZMaterial *matbase,
          TPZLinearAnalysis *an,TPZFMatrix<double> *rhs)

{
  TPZSolutionMatrix *A;
  TPZCompMesh *CompMesh;
  TPZBaseMatrix *pTVar1;
  uint uVar2;
  ostream *poVar3;
  TPZFMatrix<double> *pTVar4;
  uint uVar5;
  TPZMaterial *local_1a8;
  double local_1a0;
  _Any_data local_178;
  undefined8 local_168;
  undefined8 uStack_160;
  TPZFMatrix<double> local_150;
  TPZFMatrix<double> rhsim1;
  
  if (matbase == (TPZMaterial *)0x0) {
    local_1a8 = (TPZMaterial *)0x0;
  }
  else {
    local_1a8 = (TPZMaterial *)
                __dynamic_cast(matbase,&TPZMaterial::typeinfo,&TPZMaterialT<double>::typeinfo,0);
  }
  uVar2 = 2;
  if (2 < numiter) {
    uVar2 = numiter;
  }
  CompMesh = (an->super_TPZAnalysis).fCompMesh;
  poVar3 = std::operator<<((ostream *)&std::cout,anon_var_dwarf_20921d1);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,0);
  std::endl<char,std::char_traits<char>>(poVar3);
  pTVar1 = (an->super_TPZAnalysis).fSolution.fBaseMatrix;
  if (pTVar1 != (TPZBaseMatrix *)0x0) {
    (*(pTVar1->super_TPZSavable)._vptr_TPZSavable[0xf])();
  }
  SetDeltaTime(this,CompMesh,local_1a8);
  (*(an->super_TPZAnalysis).super_TPZSavable._vptr_TPZSavable[0xb])(an,&std::cout);
  poVar3 = std::operator<<((ostream *)&std::cout,
                           "TPZNonLinMultGridAnalysis::SmoothingSolution iteration = ");
  uVar5 = 1;
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,1);
  std::endl<char,std::char_traits<char>>(poVar3);
  (*(an->super_TPZAnalysis).super_TPZSavable._vptr_TPZSavable[0xc])(an);
  local_168 = 0;
  uStack_160 = 0;
  local_178._M_unused._M_object = (void *)0x0;
  local_178._8_8_ = 0;
  (**(code **)(*(long *)local_1a8 + 0xa0))(local_1a8,&local_178,0xffffffffffffffff);
  std::_Function_base::~_Function_base((_Function_base *)&local_178);
  A = &(this->super_TPZLinearAnalysis).super_TPZAnalysis.fSolution;
  local_1a0 = Norm(A);
  pTVar4 = TPZSolutionMatrix::operator_cast_to_TPZFMatrix_(&an->fRhs);
  TPZFMatrix<double>::TPZFMatrix(&rhsim1,pTVar4);
  while ((uVar5 < uVar2 && (local_1a0 < tol))) {
    pTVar1 = (an->super_TPZAnalysis).fSolution.fBaseMatrix;
    if (pTVar1 != (TPZBaseMatrix *)0x0) {
      (*(pTVar1->super_TPZSavable)._vptr_TPZSavable[0xf])();
    }
    SetDeltaTime(this,CompMesh,local_1a8);
    (*(an->super_TPZAnalysis).super_TPZSavable._vptr_TPZSavable[0xb])(an,&std::cout);
    (*(an->super_TPZAnalysis).super_TPZSavable._vptr_TPZSavable[0xc])(an);
    poVar3 = std::operator<<((ostream *)&std::cout,
                             "TPZNonLinMultGridAnalysis::SmoothingSolution iteracao = ");
    uVar5 = uVar5 + 1;
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,uVar5);
    std::endl<char,std::char_traits<char>>(poVar3);
    local_1a0 = Norm(A);
  }
  if (uVar5 < uVar2) {
    poVar3 = std::operator<<((ostream *)&std::cout,
                             "\nTPZNonLinMultGridAnalysis::SmoothingSolution the iterative process stopped"
                            );
    std::operator<<(poVar3," due the great norm of the solution, norm solution = ");
    poVar3 = std::ostream::_M_insert<double>(local_1a0);
    std::endl<char,std::char_traits<char>>(poVar3);
  }
  (*(an->super_TPZAnalysis).super_TPZSavable._vptr_TPZSavable[0xc])(an);
  pTVar4 = TPZSolutionMatrix::operator_cast_to_TPZFMatrix_(&an->fRhs);
  TPZFMatrix<double>::operator-(&local_150,pTVar4,&rhsim1);
  TPZFMatrix<double>::operator=(rhs,&local_150);
  TPZFMatrix<double>::~TPZFMatrix(&local_150);
  TPZFMatrix<double>::~TPZFMatrix(&rhsim1);
  return;
}

Assistant:

void TPZNonLinMultGridAnalysis::SmoothingSolution(REAL tol,int numiter,TPZMaterial * matbase,TPZLinearAnalysis &an,TPZFMatrix<STATE> &rhs){
	auto *mat =
		dynamic_cast<TPZMaterialT<STATE>*>(matbase);
	//pelo menos duas iteracoes para calcular o residuo
	if(numiter <= 1) numiter = 2;
	TPZCompMesh *anmesh = an.Mesh();
	int iter = 0;
	cout << "PZAnalysis::SmoothingSolutionTest beginning of the iterative process iterac� = " << iter << endl;
	an.Solution().Zero();
	SetDeltaTime(anmesh,mat);
	an.Run();
	cout << "TPZNonLinMultGridAnalysis::SmoothingSolution iteration = " << ++iter << endl;
	an.LoadSolution();
	mat->SetForcingFunction(nullptr,-1);
	REAL normsol = Norm(Solution());
	TPZFMatrix<STATE> rhsim1 = an.Rhs();
	
	while(iter < numiter && normsol < tol) {
		
		an.Solution().Zero();
		SetDeltaTime(anmesh,mat);
		//    rhsim1 = an.Rhs();//guarda o anterior res�uo
		an.Run();
		an.LoadSolution();
		cout << "TPZNonLinMultGridAnalysis::SmoothingSolution iteracao = " << ++iter << endl;
		normsol = Norm(Solution());
	}
	if(iter < numiter){
		cout << "\nTPZNonLinMultGridAnalysis::SmoothingSolution the iterative process stopped"
		<< " due the great norm of the solution, norm solution = " << normsol << endl;
	}
	an.LoadSolution();
	//TODOCOMPLEX
	TPZFMatrix<STATE> &myrhs = an.Rhs();
	rhs = myrhs - rhsim1;//ltimo residuo - res�uo anterior
}